

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

xml_node * xml_easy_child(xml_node *node,uint8_t *child_name,...)

{
  xml_node **ppxVar1;
  xml_string *pxVar2;
  long lVar3;
  char in_AL;
  size_t sVar4;
  void **ppvVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  undefined8 in_R8;
  size_t sVar9;
  undefined8 in_R9;
  void **ppvVar10;
  bool bVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arguments;
  uint local_f8;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (child_name != (uint8_t *)0x0) {
    local_f8 = 0x10;
    ppvVar10 = &arguments[0].overflow_arg_area;
    local_d8[2] = (void *)in_RDX;
    local_d8[3] = (void *)in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    do {
      sVar4 = strlen((char *)child_name);
      ppxVar1 = node->children;
      node = (xml_node *)0x0;
      uVar6 = 0;
      while( true ) {
        uVar7 = 0xffffffffffffffff;
        do {
          lVar8 = uVar7 + 1;
          uVar7 = uVar7 + 1;
        } while (ppxVar1[lVar8] != (xml_node *)0x0);
        if (uVar7 <= uVar6) break;
        lVar8 = -1;
        do {
          lVar3 = lVar8 + 1;
          lVar8 = lVar8 + 1;
        } while (ppxVar1[lVar3] != (xml_node *)0x0);
        pxVar2 = ppxVar1[uVar6]->name;
        if (pxVar2->length == sVar4) {
          if (sVar4 != 0) {
            sVar9 = 0;
            do {
              if (pxVar2->buffer[sVar9] != child_name[sVar9]) goto LAB_00101d25;
              sVar9 = sVar9 + 1;
            } while (sVar4 != sVar9);
          }
          bVar11 = node != (xml_node *)0x0;
          node = ppxVar1[uVar6];
          if (bVar11) {
            return (xml_node *)0x0;
          }
        }
LAB_00101d25:
        uVar6 = uVar6 + 1;
      }
      if (node == (xml_node *)0x0) {
        return (xml_node *)0x0;
      }
      if (local_f8 < 0x29) {
        uVar6 = (ulong)local_f8;
        local_f8 = local_f8 + 8;
        ppvVar5 = ppvVar10;
        ppvVar10 = (void **)((long)local_d8 + uVar6);
      }
      else {
        ppvVar5 = ppvVar10 + 1;
      }
      child_name = (uint8_t *)*ppvVar10;
      ppvVar10 = ppvVar5;
    } while (child_name != (uint8_t *)0x0);
  }
  return node;
}

Assistant:

struct xml_node* xml_easy_child(struct xml_node* node, uint8_t const* child_name, ...) {

	/* Find children, one by one
	 */
	struct xml_node* current = node;

	va_list arguments;
	va_start(arguments, child_name);


	/* Descent to current.child
	 */
	while (child_name) {

		/* Convert child_name to xml_string for easy comparison
		 */
		struct xml_string cn = {
			.buffer = child_name,
			.length = strlen(child_name)
		};

		/* Interate through all children
		 */
		struct xml_node* next = 0;

		size_t i = 0; for (; i < xml_node_children(current); ++i) {
			struct xml_node* child = xml_node_child(current, i);

			if (xml_string_equals(xml_node_name(child), &cn)) {
				if (!next) {
					next = child;

				/* Two children with the same name
				 */
				} else {
					va_end(arguments);
					return 0;
				}
			}
		}

		/* No child with that name found
		 */
		if (!next) {
			va_end(arguments);
			return 0;
		}
		current = next;		
		
		/* Find name of next child
		 */
		child_name = va_arg(arguments, uint8_t const*);
	}
	va_end(arguments);


	/* Return current element
	 */
	return current;
}